

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O0

_Bool ethash_quick_check_difficulty
                (ethash_h256_t *header_hash,uint64_t nonce,ethash_h256_t *mix_hash,
                ethash_h256_t *boundary)

{
  _Bool _Var1;
  ethash_h256_t return_hash;
  ethash_h256_t *in_stack_ffffffffffffffc0;
  ethash_h256_t *in_stack_ffffffffffffffc8;
  
  ethash_quick_hash(mix_hash,boundary,return_hash.b._24_8_,(ethash_h256_t *)return_hash.b._16_8_);
  _Var1 = ethash_check_difficulty(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  return _Var1;
}

Assistant:

bool ethash_quick_check_difficulty(
	ethash_h256_t const* header_hash,
	uint64_t const nonce,
	ethash_h256_t const* mix_hash,
	ethash_h256_t const* boundary
)
{

	ethash_h256_t return_hash;
	ethash_quick_hash(&return_hash, header_hash, nonce, mix_hash);
	return ethash_check_difficulty(&return_hash, boundary);
}